

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

void __thiscall antlr::ASTFactory::makeASTRoot(ASTFactory *this,ASTPair *currentAST,RefAST *root)

{
  AST *pAVar1;
  ASTRefCount *in_RDX;
  ASTPair *in_RSI;
  ASTRefCount<antlr::AST> *other;
  ASTRefCount *this_00;
  ASTRefCount<antlr::AST> *in_stack_ffffffffffffffd0;
  ASTRefCount<antlr::AST> local_20 [2];
  
  this_00 = in_RDX;
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 != (AST *)0x0) {
    pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)this_00);
    other = local_20;
    ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX,other);
    (*pAVar1->_vptr_AST[0xb])(pAVar1,other);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_RDX);
    ASTRefCount<antlr::AST>::operator=(in_stack_ffffffffffffffd0,(ASTRefCount<antlr::AST> *)this_00)
    ;
    ASTPair::advanceChildToEnd(in_RSI);
    ASTRefCount<antlr::AST>::operator=(in_stack_ffffffffffffffd0,(ASTRefCount<antlr::AST> *)this_00)
    ;
  }
  return;
}

Assistant:

void ASTFactory::makeASTRoot( ASTPair& currentAST, RefAST root )
{
	if (root)
	{
		// Add the current root as a child of new root
		root->addChild(currentAST.root);
		// The new current child is the last sibling of the old root
		currentAST.child = currentAST.root;
		currentAST.advanceChildToEnd();
		// Set the new root
		currentAST.root = root;
	}
}